

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void IDLExport::checkType(Type *type)

{
  Type *pTVar1;
  int iVar2;
  UnsupportedType *pUVar3;
  allocator local_71;
  string local_70;
  int local_4c;
  undefined1 local_45;
  Category pointed_to;
  allocator local_31;
  string local_30;
  Type *local_10;
  Type *type_local;
  
  local_10 = type;
  iVar2 = Typelib::Type::getCategory();
  if (iVar2 == 2) {
    local_45 = 1;
    pUVar3 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    pTVar1 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"pointers are not allowed in IDL",&local_31);
    Typelib::UnsupportedType::UnsupportedType(pUVar3,pTVar1,&local_30);
    local_45 = 0;
    __cxa_throw(pUVar3,&Typelib::UnsupportedType::typeinfo,
                Typelib::UnsupportedType::~UnsupportedType);
  }
  iVar2 = Typelib::Type::getCategory();
  if (iVar2 == 1) {
    Typelib::Indirect::getIndirection();
    local_4c = Typelib::Type::getCategory();
    if ((local_4c == 1) || (local_4c == 2)) {
      pUVar3 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      pTVar1 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_70,"multi-dimensional arrays are not supported yet",&local_71);
      Typelib::UnsupportedType::UnsupportedType(pUVar3,pTVar1,&local_70);
      __cxa_throw(pUVar3,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
  }
  return;
}

Assistant:

void IDLExport::checkType(Type const& type)
{
    if (type.getCategory() == Type::Pointer)
        throw UnsupportedType(type, "pointers are not allowed in IDL");
    if (type.getCategory() == Type::Array)
    {
        Type::Category pointed_to = static_cast<Indirect const&>(type).getIndirection().getCategory();
        if (pointed_to == Type::Array || pointed_to == Type::Pointer)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported yet");
    }

}